

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Scanner::fetchMoreTokens(Scanner *this)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  size_type sVar7;
  StringRef Chars;
  StringRef FirstChar;
  StringRef local_38;
  Twine local_28;
  
  if (this->IsStartOfStream == true) {
    scanStreamStart(this);
    return true;
  }
  scanToNextToken(this);
  if (this->Current == this->End) {
    scanStreamEnd(this);
    return true;
  }
  removeStaleSimpleKeyCandidates(this);
  unrollIndent(this,this->Column);
  if (this->Column == 0) {
    if (*this->Current == '%') {
      bVar5 = scanDirective(this);
      return bVar5;
    }
    pcVar4 = this->Current;
    if (((((pcVar4 + 4 <= this->End) && (*pcVar4 == '-')) && (pcVar4[1] == '-')) &&
        (pcVar4[2] == '-')) &&
       ((pcVar4 + 3 == this->End ||
        ((uVar6 = (ulong)(byte)pcVar4[3], uVar6 < 0x21 &&
         ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))))) {
      bVar5 = true;
LAB_0016a963:
      scanDocumentIndicator(this,bVar5);
      return true;
    }
    pcVar4 = this->Current;
    if ((pcVar4 + 4 <= this->End) &&
       ((((*pcVar4 == '.' && (pcVar4[1] == '.')) && (pcVar4[2] == '.')) &&
        ((pcVar4 + 3 == this->End ||
         ((uVar6 = (ulong)(byte)pcVar4[3], uVar6 < 0x21 &&
          ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))))))) {
      bVar5 = false;
      goto LAB_0016a963;
    }
  }
  local_38.Data = this->Current;
  bVar2 = *local_38.Data;
  if (bVar2 < 0x3f) {
    switch(bVar2) {
    case 0x26:
switchD_0016a7b6_caseD_26:
      bVar5 = false;
      goto LAB_0016aa7b;
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2b:
      break;
    case 0x2a:
switchD_0016a7b6_caseD_2a:
      bVar5 = true;
LAB_0016aa7b:
      bVar5 = scanAliasOrAnchor(this,bVar5);
      return bVar5;
    case 0x2c:
      scanFlowEntry(this);
      return true;
    case 0x2d:
      if ((((byte *)this->End != (byte *)local_38.Data + 1) &&
          (uVar6 = (ulong)((byte *)local_38.Data)[1], uVar6 < 0x21)) &&
         ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
        scanBlockEntry(this);
        return true;
      }
      if (bVar2 < 0x3a) {
        if (bVar2 == 0x21) goto LAB_0016aa5a;
        if (bVar2 == 0x26) goto switchD_0016a7b6_caseD_26;
        goto LAB_0016aa6e;
      }
      if (bVar2 == 0x3a) goto LAB_0016a8b8;
      if (bVar2 == 0x7c) goto LAB_0016aa87;
      if (bVar2 == 0x3f) goto LAB_0016a9fa;
      break;
    default:
      if (bVar2 == 0x21) goto LAB_0016aa5a;
LAB_0016a8af:
      if (bVar2 == 0x3a) {
LAB_0016a8b8:
        if ((this->FlowLevel != 0) ||
           ((((byte *)this->End != (byte *)local_38.Data + 1 &&
             (uVar6 = (ulong)((byte *)local_38.Data)[1], uVar6 < 0x21)) &&
            ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))) {
          scanValue(this);
          return true;
        }
        if (bVar2 < 0x2a) goto LAB_0016aa4a;
        if (bVar2 == 0x7c) goto LAB_0016aa87;
LAB_0016aa6e:
        if (bVar2 == 0x2a) goto switchD_0016a7b6_caseD_2a;
      }
    }
  }
  else if (bVar2 < 0x7b) {
    if (bVar2 == 0x3f) {
LAB_0016a9fa:
      if ((this->FlowLevel != 0) ||
         ((((byte *)this->End != (byte *)local_38.Data + 1 &&
           (uVar6 = (ulong)((byte *)local_38.Data)[1], uVar6 < 0x21)) &&
          ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))) {
        scanKey(this);
        return true;
      }
      if (0x29 < bVar2) {
        if (bVar2 != 0x2a) {
          if (bVar2 != 0x7c) goto LAB_0016a8af;
          goto LAB_0016aa87;
        }
        goto switchD_0016a7b6_caseD_2a;
      }
LAB_0016aa4a:
      if (bVar2 == 0x21) {
LAB_0016aa5a:
        bVar5 = scanTag(this);
        return bVar5;
      }
      if (bVar2 == 0x26) goto switchD_0016a7b6_caseD_26;
    }
    else {
      if (bVar2 == 0x5b) {
        bVar5 = true;
        goto LAB_0016a9b9;
      }
      if (bVar2 == 0x5d) {
        bVar5 = true;
LAB_0016a836:
        scanFlowCollectionEnd(this,bVar5);
        return true;
      }
    }
  }
  else {
    if (bVar2 == 0x7b) {
      bVar5 = false;
LAB_0016a9b9:
      scanFlowCollectionStart(this,bVar5);
      return true;
    }
    if (bVar2 == 0x7c) {
LAB_0016aa87:
      if (this->FlowLevel == 0) goto LAB_0016aa98;
    }
    else if (bVar2 == 0x7d) {
      bVar5 = false;
      goto LAB_0016a836;
    }
  }
  if ((bVar2 == 0x3e) && (this->FlowLevel == 0)) {
LAB_0016aa98:
    bVar5 = scanBlockScalar(this,false);
    return bVar5;
  }
  if (bVar2 == 0x22) {
    bVar5 = true;
  }
  else {
    if (bVar2 != 0x27) {
      local_38.Length = 1;
      if ((((this->End != local_38.Data) && ((ulong)(byte)*local_38.Data < 0x21)) &&
          ((0x100002600U >> ((ulong)(byte)*local_38.Data & 0x3f) & 1) != 0)) ||
         (Chars.Length = 0x13, Chars.Data = "-?:,[]{}#&*!|>\'\"%@`",
         sVar7 = StringRef::find_first_of(&local_38,Chars,0), sVar7 != 0xffffffffffffffff)) {
        pcVar4 = this->Current;
        cVar3 = *pcVar4;
        if ((cVar3 != '-') ||
           (((this->End != pcVar4 + 1 && (uVar6 = (ulong)(byte)pcVar4[1], uVar6 < 0x21)) &&
            ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))) {
          if (this->FlowLevel == 0) {
            if (((cVar3 == '?') || (cVar3 == ':')) &&
               ((this->End != pcVar4 + 1 &&
                ((uVar6 = (ulong)(byte)pcVar4[1], uVar6 < 0x21 &&
                 ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))))) goto LAB_0016aba7;
            if (cVar3 == ':') {
              pbVar1 = (byte *)(pcVar4 + 2);
              if (((pbVar1 < this->End) && (pcVar4[1] == ':')) &&
                 (((byte *)this->End == pbVar1 ||
                  ((0x20 < (ulong)*pbVar1 || ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0))))
                 )) goto LAB_0016aba7;
            }
          }
          Twine::Twine(&local_28,"Unrecognized character while tokenizing.");
          setError(this,&local_28,this->Current);
          return false;
        }
      }
LAB_0016aba7:
      bVar5 = scanPlainScalar(this);
      return bVar5;
    }
    bVar5 = false;
  }
  bVar5 = scanFlowScalar(this,bVar5);
  return bVar5;
}

Assistant:

bool Scanner::fetchMoreTokens() {
  if (IsStartOfStream)
    return scanStreamStart();

  scanToNextToken();

  if (Current == End)
    return scanStreamEnd();

  removeStaleSimpleKeyCandidates();

  unrollIndent(Column);

  if (Column == 0 && *Current == '%')
    return scanDirective();

  if (Column == 0 && Current + 4 <= End
      && *Current == '-'
      && *(Current + 1) == '-'
      && *(Current + 2) == '-'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(true);

  if (Column == 0 && Current + 4 <= End
      && *Current == '.'
      && *(Current + 1) == '.'
      && *(Current + 2) == '.'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(false);

  if (*Current == '[')
    return scanFlowCollectionStart(true);

  if (*Current == '{')
    return scanFlowCollectionStart(false);

  if (*Current == ']')
    return scanFlowCollectionEnd(true);

  if (*Current == '}')
    return scanFlowCollectionEnd(false);

  if (*Current == ',')
    return scanFlowEntry();

  if (*Current == '-' && isBlankOrBreak(Current + 1))
    return scanBlockEntry();

  if (*Current == '?' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanKey();

  if (*Current == ':' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanValue();

  if (*Current == '*')
    return scanAliasOrAnchor(true);

  if (*Current == '&')
    return scanAliasOrAnchor(false);

  if (*Current == '!')
    return scanTag();

  if (*Current == '|' && !FlowLevel)
    return scanBlockScalar(true);

  if (*Current == '>' && !FlowLevel)
    return scanBlockScalar(false);

  if (*Current == '\'')
    return scanFlowScalar(false);

  if (*Current == '"')
    return scanFlowScalar(true);

  // Get a plain scalar.
  StringRef FirstChar(Current, 1);
  if (!(isBlankOrBreak(Current)
        || FirstChar.find_first_of("-?:,[]{}#&*!|>'\"%@`") != StringRef::npos)
      || (*Current == '-' && !isBlankOrBreak(Current + 1))
      || (!FlowLevel && (*Current == '?' || *Current == ':')
          && isBlankOrBreak(Current + 1))
      || (!FlowLevel && *Current == ':'
                      && Current + 2 < End
                      && *(Current + 1) == ':'
                      && !isBlankOrBreak(Current + 2)))
    return scanPlainScalar();

  setError("Unrecognized character while tokenizing.");
  return false;
}